

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccnr.cc
# Opt level: O2

bool __thiscall CCNR::ls_solver::parse_arguments(ls_solver *this,int argc,char **argv)

{
  char *__s1;
  int iVar1;
  bool bVar2;
  int i;
  int iVar3;
  
  iVar3 = 1;
  bVar2 = false;
  do {
    if (argc <= iVar3) {
      return bVar2;
    }
    __s1 = argv[iVar3];
    iVar1 = strcmp(__s1,"-inst");
    if (iVar1 == 0) {
      iVar3 = iVar3 + 1;
      if (argc <= iVar3) {
        return false;
      }
      std::__cxx11::string::assign((char *)this);
      bVar2 = true;
    }
    else {
      iVar1 = strcmp(__s1,"-seed");
      if (iVar1 == 0) {
        iVar3 = iVar3 + 1;
        if (argc <= iVar3) {
          return false;
        }
        __isoc99_sscanf(argv[iVar3],"%d",&this->_random_seed);
      }
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

bool ls_solver::parse_arguments(int argc, char **argv)
{
    bool flag_inst = false;
    for (int i = 1; i < argc; i++) {
        if (strcmp(argv[i], "-inst") == 0) {
            i++;
            if (i >= argc) return false;
            _inst_file = argv[i];
            flag_inst = true;
            continue;
        } else if (strcmp(argv[i], "-seed") == 0) {
            i++;
            if (i >= argc) return false;
            sscanf(argv[i], "%d", &_random_seed);
            continue;
        }
    }
    if (flag_inst)
        return true;
    else
        return false;
}